

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::ToolBar::clear(ToolBar *this)

{
  int i;
  long lVar1;
  QList<QAction_*> actions;
  QArrayDataPointer<QAction_*> QStack_28;
  
  QWidget::actions();
  for (lVar1 = 0; lVar1 < QStack_28.size; lVar1 = lVar1 + 1) {
    QWidget::removeAction((QAction *)this);
  }
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&QStack_28);
  return;
}

Assistant:

void
ToolBar::clear()
{
	QList< QAction* > actions = this->actions();

	for( int i = 0; i < actions.size(); ++i )
		removeAction( actions.at( i ) );
}